

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.hpp
# Opt level: O2

SquareMatrix3<double> * __thiscall
OpenMD::RNEMD::SPFForceManager::linearCombination<OpenMD::SquareMatrix3<double>>
          (SquareMatrix3<double> *__return_storage_ptr__,SPFForceManager *this,
          SquareMatrix3<double> *quantityA,SquareMatrix3<double> *quantityB)

{
  double dVar1;
  double dVar2;
  undefined1 local_148 [144];
  RectMatrix<double,_3U,_3U> local_b8;
  RectMatrix<double,_3U,_3U> local_70;
  
  Snapshot::getSPFData((Snapshot *)local_148);
  dVar1 = pow((((pointer)(local_148._0_8_ + 0x18))->super_Vector<double,_3U>).data_[0],
              (double)this->k_);
  dVar2 = 1.0;
  if (dVar1 <= 1.0) {
    dVar2 = dVar1;
  }
  dVar2 = (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  operator*(&local_b8,1.0 - dVar2,(RectMatrix<double,_3U,_3U> *)quantityA);
  operator*((RectMatrix<double,_3U,_3U> *)(local_148 + 0x48),dVar2,
            (RectMatrix<double,_3U,_3U> *)quantityB);
  OpenMD::operator+(&local_70,&local_b8,(RectMatrix<double,_3U,_3U> *)(local_148 + 0x48));
  RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)local_148,&local_70);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)__return_storage_ptr__,
             (RectMatrix<double,_3U,_3U> *)local_148);
  return __return_storage_ptr__;
}

Assistant:

T linearCombination(T quantityA, T quantityB) {
      RealType result = f_lambda(currentSnapshot_->getSPFData()->lambda);

      return T {(1.0 - result) * quantityA + result * quantityB};
    }